

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.h
# Opt level: O0

void GC::Mark<VMFunction>(VMFunction **obj)

{
  VMFunction *local_18;
  anon_union_8_2_947301c6 anon_var_0;
  VMFunction **obj_local;
  
  local_18 = *obj;
  anon_var_0 = (anon_union_8_2_947301c6)obj;
  Mark((DObject **)&local_18);
  ((anon_var_0.t)->super_DObject)._vptr_DObject = (_func_int **)local_18;
  return;
}

Assistant:

void Mark(T *&obj)
	{
		union
		{
			T *t;
			DObject *o;
		};
		o = obj;
		Mark(&o);
		obj = t;
	}